

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

int Ifn_ManSatCheckOne(sat_solver *pSat,Vec_Int_t *vPoVars,word *pTruth,int nVars,int *pPerm,
                      int nInps,Vec_Int_t *vLits)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar8 = 1 << ((byte)nVars & 0x1f);
  uVar6 = vPoVars->nSize;
  if (1 << ((byte)nInps & 0x1f) != uVar6) {
    __assert_fail("(1 << nInps) == Vec_IntSize(vPoVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x299,
                  "int Ifn_ManSatCheckOne(sat_solver *, Vec_Int_t *, word *, int, int *, int, Vec_Int_t *)"
                 );
  }
  if (nInps < nVars) {
    __assert_fail("nVars <= nInps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x29a,
                  "int Ifn_ManSatCheckOne(sat_solver *, Vec_Int_t *, word *, int, int *, int, Vec_Int_t *)"
                 );
  }
  if (vLits->nCap < (int)uVar6) {
    if (vLits->pArray == (int *)0x0) {
      piVar2 = (int *)malloc((long)(int)uVar6 << 2);
    }
    else {
      piVar2 = (int *)realloc(vLits->pArray,(long)(int)uVar6 << 2);
    }
    vLits->pArray = piVar2;
    if (piVar2 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vLits->nCap = uVar6;
  }
  if (0 < (int)uVar6) {
    memset(vLits->pArray,0xff,(ulong)uVar6 * 4);
  }
  vLits->nSize = uVar6;
  if (nVars != 0x1f) {
    if ((int)uVar8 < 2) {
      uVar8 = 1;
    }
    uVar5 = 0;
    do {
      uVar6 = 0;
      if (0 < nInps) {
        uVar3 = 0;
        uVar6 = 0;
        do {
          if (nVars <= pPerm[uVar3]) {
            __assert_fail("pPerm[v] < nVars",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                          ,0x2a2,
                          "int Ifn_ManSatCheckOne(sat_solver *, Vec_Int_t *, word *, int, int *, int, Vec_Int_t *)"
                         );
          }
          uVar7 = 1 << ((byte)uVar3 & 0x1f);
          if (((uint)uVar5 >> (pPerm[uVar3] & 0x1fU) & 1) == 0) {
            uVar7 = 0;
          }
          uVar6 = uVar6 | uVar7;
          uVar3 = uVar3 + 1;
        } while ((uint)nInps != uVar3);
      }
      if (((int)uVar6 < 0) || (vLits->nSize <= (int)uVar6)) goto LAB_0043b041;
      if (vLits->pArray[uVar6] != -1) {
        __assert_fail("Vec_IntEntry(vLits, mNew) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x2a6,
                      "int Ifn_ManSatCheckOne(sat_solver *, Vec_Int_t *, word *, int, int *, int, Vec_Int_t *)"
                     );
      }
      vLits->pArray[uVar6] = (uint)((pTruth[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0);
      uVar6 = (uint)uVar5 + 1;
      uVar5 = (ulong)uVar6;
    } while (uVar6 != uVar8);
  }
  uVar6 = vLits->nSize;
  uVar5 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar8 = 0;
  }
  else {
    piVar2 = vLits->pArray;
    lVar4 = 0;
    uVar8 = 0;
    do {
      iVar1 = piVar2[lVar4];
      if (-1 < iVar1) {
        if (vPoVars->nSize <= lVar4) {
LAB_0043b041:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (vPoVars->pArray[lVar4] < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        if (((int)uVar8 < 0) || ((int)uVar5 <= (int)uVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar5 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
        piVar2[uVar5] = (uint)(iVar1 == 0) + vPoVars->pArray[lVar4] * 2;
      }
      lVar4 = lVar4 + 1;
      uVar6 = vLits->nSize;
      uVar5 = (ulong)(int)uVar6;
    } while (lVar4 < (long)uVar5);
  }
  if ((int)uVar6 < (int)uVar8) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vLits->nSize = uVar8;
  iVar1 = sat_solver_solve(pSat,vLits->pArray,vLits->pArray + (int)uVar8,0,0,0,0);
  return (int)(iVar1 == 1);
}

Assistant:

int Ifn_ManSatCheckOne( sat_solver * pSat, Vec_Int_t * vPoVars, word * pTruth, int nVars, int * pPerm, int nInps, Vec_Int_t * vLits )
{
    int v, Value, m, mNew, nMints = (1 << nVars); // (1 << nInps);
    assert( (1 << nInps) == Vec_IntSize(vPoVars) );
    assert( nVars <= nInps );
    // remap minterms
    Vec_IntFill( vLits, Vec_IntSize(vPoVars), -1 );
    for ( m = 0; m < nMints; m++ )
    {
        mNew = 0;
        for ( v = 0; v < nInps; v++ )
        {
            assert( pPerm[v] < nVars );
            if ( ((m >> pPerm[v]) & 1) )
                mNew |= (1 << v);
        }
        assert( Vec_IntEntry(vLits, mNew) == -1 );
        Vec_IntWriteEntry( vLits, mNew, Abc_TtGetBit(pTruth, m) );
    }
    // find assumptions
    v = 0;
    Vec_IntForEachEntry( vLits, Value, m )
        if ( Value >= 0 )
            Vec_IntWriteEntry( vLits, v++, Abc_Var2Lit(Vec_IntEntry(vPoVars, m), !Value) );
    Vec_IntShrink( vLits, v );
    // run SAT solver
    Value = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
    return (int)(Value == l_True);
}